

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<std::array<QImage,_16UL>,_6LL>::~QVarLengthArray
          (QVarLengthArray<std::array<QImage,_16UL>,_6LL> *this)

{
  array<QImage,_16UL> *paVar1;
  QVLABaseBase *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  array<QImage,_16UL> *in_stack_ffffffffffffffe0;
  
  QVLABase<std::array<QImage,_16UL>_>::data((QVLABase<std::array<QImage,_16UL>_> *)in_RDI);
  QVLABaseBase::size(in_RDI);
  std::destroy_n<std::array<QImage,16ul>*,long_long>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  paVar1 = QVLABase<std::array<QImage,_16UL>_>::data((QVLABase<std::array<QImage,_16UL>_> *)in_RDI);
  if (paVar1 != (array<QImage,_16UL> *)(in_RDI + 1)) {
    paVar1 = QVLABase<std::array<QImage,_16UL>_>::data
                       ((QVLABase<std::array<QImage,_16UL>_> *)in_RDI);
    QVLABaseBase::capacity(in_RDI);
    QtPrivate::sizedFree(paVar1,in_stack_ffffffffffffffd8,0x6b2b5b);
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }